

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

uint64_t calc_next_pn_to_skip(ptls_context_t *tlsctx,uint64_t next_pn,uint32_t cwnd,uint64_t mtu)

{
  long lVar1;
  long lVar2;
  ulong in_RCX;
  uint in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  long *in_FS_OFFSET;
  uint64_t skip_after;
  uint32_t packet_cwnd;
  undefined4 local_24;
  
  if (*(long *)(*in_FS_OFFSET + -8) == 0) {
    (*(code *)*in_RDI)(*in_FS_OFFSET + -0x28,0x20);
    *(undefined8 *)(*in_FS_OFFSET + -8) = 8;
  }
  local_24 = (uint)(in_EDX / in_RCX);
  if (local_24 < 0x20) {
    local_24 = 0x20;
  }
  lVar1 = *in_FS_OFFSET;
  lVar2 = *(long *)(*in_FS_OFFSET + -8);
  *(long *)(*in_FS_OFFSET + -8) = lVar2 + -1;
  return in_RSI + 1 + (ulong)*(uint *)(lVar1 + -0x2c + lVar2 * 4) % (ulong)(local_24 << 4);
}

Assistant:

static uint64_t calc_next_pn_to_skip(ptls_context_t *tlsctx, uint64_t next_pn, uint32_t cwnd, uint64_t mtu)
{
    static __thread struct {
        uint32_t values[8];
        size_t off;
    } cached_rand;

    if (cached_rand.off == 0) {
        tlsctx->random_bytes(cached_rand.values, sizeof(cached_rand.values));
        cached_rand.off = PTLS_ELEMENTSOF(cached_rand.values);
    }

    /* on average, skip one PN per every min(256 packets, 8 * CWND) */
    uint32_t packet_cwnd = cwnd / mtu;
    if (packet_cwnd < 32)
        packet_cwnd = 32;
    uint64_t skip_after = cached_rand.values[--cached_rand.off] % (16 * packet_cwnd);
    return next_pn + 1 + skip_after;
}